

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_extract_back_Test::~IntrusiveListTest_extract_back_Test
          (IntrusiveListTest_extract_back_Test *this)

{
  IntrusiveListTest_extract_back_Test *this_local;
  
  ~IntrusiveListTest_extract_back_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, extract_back) {
  TestObjectList list = NewList({1, 2, 3});

  std::unique_ptr<TestObject> t1(list.extract_back());
  ASSERT_EQ(3, t1->data);
  AssertListEq(list, {1, 2});

  std::unique_ptr<TestObject> t2(list.extract_back());
  ASSERT_EQ(2, t2->data);
  AssertListEq(list, {1});

  std::unique_ptr<TestObject> t3(list.extract_back());
  ASSERT_EQ(1, t3->data);
  AssertListEq(list, {});
}